

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 (*pauVar31) [16];
  uint uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  Scene *pSVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [32];
  undefined1 auVar68 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  float fVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar98 [64];
  float fVar105;
  float fVar107;
  undefined1 auVar106 [32];
  float fVar108;
  undefined4 uVar109;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [32];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [32];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1560 [16];
  undefined1 (*local_1548) [16];
  long local_1540;
  ulong local_1538;
  RTCFilterFunctionNArguments local_1530;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  Scene *local_1460;
  undefined1 auStack_1458 [24];
  float local_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float local_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float local_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  RTCHitN local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined4 local_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  uint local_1300;
  uint uStack_12fc;
  uint uStack_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  undefined1 local_12e0 [16];
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar42 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar109 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13b0._4_4_ = uVar109;
  local_13b0._0_4_ = uVar109;
  local_13b0._8_4_ = uVar109;
  local_13b0._12_4_ = uVar109;
  auVar92 = ZEXT1664(local_13b0);
  uVar109 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = uVar109;
  local_13c0._0_4_ = uVar109;
  local_13c0._8_4_ = uVar109;
  local_13c0._12_4_ = uVar109;
  auVar93 = ZEXT1664(local_13c0);
  uVar109 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13d0._4_4_ = uVar109;
  local_13d0._0_4_ = uVar109;
  local_13d0._8_4_ = uVar109;
  local_13d0._12_4_ = uVar109;
  auVar98 = ZEXT1664(local_13d0);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar125 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar105 = fVar115 * 0.99999964;
  fVar108 = fVar120 * 0.99999964;
  fVar113 = fVar125 * 0.99999964;
  fVar115 = fVar115 * 1.0000004;
  fVar120 = fVar120 * 1.0000004;
  fVar125 = fVar125 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1538 = uVar41 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  local_14b0._4_4_ = iVar2;
  local_14b0._0_4_ = iVar2;
  local_14b0._8_4_ = iVar2;
  local_14b0._12_4_ = iVar2;
  auVar88 = ZEXT1664(local_14b0);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar49 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  local_1548 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar69._8_4_ = 0x3f800000;
  auVar69._0_8_ = 0x3f8000003f800000;
  auVar69._12_4_ = 0x3f800000;
  auVar69._16_4_ = 0x3f800000;
  auVar69._20_4_ = 0x3f800000;
  auVar69._24_4_ = 0x3f800000;
  auVar69._28_4_ = 0x3f800000;
  auVar52._8_4_ = 0xbf800000;
  auVar52._0_8_ = 0xbf800000bf800000;
  auVar52._12_4_ = 0xbf800000;
  auVar52._16_4_ = 0xbf800000;
  auVar52._20_4_ = 0xbf800000;
  auVar52._24_4_ = 0xbf800000;
  auVar52._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar69,auVar52,local_1100);
  fVar107 = fVar105;
  fVar94 = fVar105;
  fVar81 = fVar105;
  fVar82 = fVar108;
  fVar83 = fVar108;
  fVar84 = fVar108;
  fVar85 = fVar113;
  fVar86 = fVar113;
  fVar114 = fVar113;
  fVar117 = fVar115;
  fVar118 = fVar115;
  fVar119 = fVar115;
  fVar122 = fVar120;
  fVar123 = fVar120;
  fVar124 = fVar120;
  fVar127 = fVar125;
  fVar128 = fVar125;
  fVar129 = fVar125;
  local_1430 = fVar125;
  fStack_142c = fVar125;
  fStack_1428 = fVar125;
  fStack_1424 = fVar125;
  local_1420 = fVar120;
  fStack_141c = fVar120;
  fStack_1418 = fVar120;
  fStack_1414 = fVar120;
  local_1410 = fVar115;
  fStack_140c = fVar115;
  fStack_1408 = fVar115;
  fStack_1404 = fVar115;
  local_1400 = fVar113;
  fStack_13fc = fVar113;
  fStack_13f8 = fVar113;
  fStack_13f4 = fVar113;
  local_13f0 = fVar108;
  fStack_13ec = fVar108;
  fStack_13e8 = fVar108;
  fStack_13e4 = fVar108;
  local_13e0 = fVar105;
  fStack_13dc = fVar105;
  fStack_13d8 = fVar105;
  fStack_13d4 = fVar105;
LAB_0158a060:
  do {
    do {
      if (pauVar42 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar31 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar31 + 8));
    uVar44 = *(ulong *)*pauVar42;
    while ((uVar44 & 8) == 0) {
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar41),auVar92._0_16_);
      auVar50._0_4_ = fVar105 * auVar51._0_4_;
      auVar50._4_4_ = fVar107 * auVar51._4_4_;
      auVar50._8_4_ = fVar94 * auVar51._8_4_;
      auVar50._12_4_ = fVar81 * auVar51._12_4_;
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar40),auVar93._0_16_);
      auVar60._0_4_ = fVar108 * auVar51._0_4_;
      auVar60._4_4_ = fVar82 * auVar51._4_4_;
      auVar60._8_4_ = fVar83 * auVar51._8_4_;
      auVar60._12_4_ = fVar84 * auVar51._12_4_;
      auVar51 = vmaxps_avx(auVar50,auVar60);
      auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar38),auVar98._0_16_);
      auVar61._0_4_ = fVar113 * auVar50._0_4_;
      auVar61._4_4_ = fVar85 * auVar50._4_4_;
      auVar61._8_4_ = fVar86 * auVar50._8_4_;
      auVar61._12_4_ = fVar114 * auVar50._12_4_;
      auVar50 = vmaxps_avx(auVar61,auVar88._0_16_);
      local_12e0 = vmaxps_avx(auVar51,auVar50);
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + local_1538),auVar92._0_16_);
      auVar62._0_4_ = fVar115 * auVar51._0_4_;
      auVar62._4_4_ = fVar117 * auVar51._4_4_;
      auVar62._8_4_ = fVar118 * auVar51._8_4_;
      auVar62._12_4_ = fVar119 * auVar51._12_4_;
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar40 ^ 0x10)),auVar93._0_16_);
      auVar66._0_4_ = fVar120 * auVar51._0_4_;
      auVar66._4_4_ = fVar122 * auVar51._4_4_;
      auVar66._8_4_ = fVar123 * auVar51._8_4_;
      auVar66._12_4_ = fVar124 * auVar51._12_4_;
      auVar51 = vminps_avx(auVar62,auVar66);
      auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar38 ^ 0x10)),auVar98._0_16_);
      auVar67._0_4_ = fVar125 * auVar50._0_4_;
      auVar67._4_4_ = fVar127 * auVar50._4_4_;
      auVar67._8_4_ = fVar128 * auVar50._8_4_;
      auVar67._12_4_ = fVar129 * auVar50._12_4_;
      auVar50 = vminps_avx(auVar67,auVar49._0_16_);
      auVar51 = vminps_avx(auVar51,auVar50);
      auVar51 = vcmpps_avx(local_12e0,auVar51,2);
      uVar32 = vmovmskps_avx(auVar51);
      if (uVar32 == 0) goto LAB_0158a060;
      uVar32 = uVar32 & 0xff;
      uVar43 = uVar44 & 0xfffffffffffffff0;
      lVar39 = 0;
      for (uVar44 = (ulong)uVar32; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        lVar39 = lVar39 + 1;
      }
      uVar44 = *(ulong *)(uVar43 + lVar39 * 8);
      uVar32 = uVar32 - 1 & uVar32;
      uVar35 = (ulong)uVar32;
      if (uVar32 != 0) {
        uVar33 = *(uint *)(local_12e0 + lVar39 * 4);
        lVar39 = 0;
        for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar39 = lVar39 + 1;
        }
        uVar32 = uVar32 - 1 & uVar32;
        uVar36 = (ulong)uVar32;
        uVar35 = *(ulong *)(uVar43 + lVar39 * 8);
        uVar4 = *(uint *)(local_12e0 + lVar39 * 4);
        if (uVar32 == 0) {
          if (uVar33 < uVar4) {
            *(ulong *)*pauVar42 = uVar35;
            *(uint *)(*pauVar42 + 8) = uVar4;
            pauVar42 = pauVar42 + 1;
          }
          else {
            *(ulong *)*pauVar42 = uVar44;
            *(uint *)(*pauVar42 + 8) = uVar33;
            pauVar42 = pauVar42 + 1;
            uVar44 = uVar35;
          }
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar44;
          auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar33));
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar35;
          auVar50 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar4));
          lVar39 = 0;
          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar32 = uVar32 - 1 & uVar32;
          uVar44 = (ulong)uVar32;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = *(ulong *)(uVar43 + lVar39 * 8);
          auVar61 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_12e0 + lVar39 * 4)));
          auVar60 = vpcmpgtd_avx(auVar50,auVar51);
          if (uVar32 == 0) {
            auVar62 = vpshufd_avx(auVar60,0xaa);
            auVar60 = vblendvps_avx(auVar50,auVar51,auVar62);
            auVar51 = vblendvps_avx(auVar51,auVar50,auVar62);
            auVar50 = vpcmpgtd_avx(auVar61,auVar60);
            auVar62 = vpshufd_avx(auVar50,0xaa);
            auVar50 = vblendvps_avx(auVar61,auVar60,auVar62);
            auVar60 = vblendvps_avx(auVar60,auVar61,auVar62);
            auVar61 = vpcmpgtd_avx(auVar60,auVar51);
            auVar62 = vpshufd_avx(auVar61,0xaa);
            auVar61 = vblendvps_avx(auVar60,auVar51,auVar62);
            auVar51 = vblendvps_avx(auVar51,auVar60,auVar62);
            *pauVar42 = auVar51;
            pauVar42[1] = auVar61;
            uVar44 = auVar50._0_8_;
            pauVar42 = pauVar42 + 2;
          }
          else {
            lVar39 = 0;
            for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
            auVar78._8_8_ = 0;
            auVar78._0_8_ = *(ulong *)(uVar43 + lVar39 * 8);
            auVar66 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_12e0 + lVar39 * 4)));
            auVar62 = vpshufd_avx(auVar60,0xaa);
            auVar60 = vblendvps_avx(auVar50,auVar51,auVar62);
            auVar51 = vblendvps_avx(auVar51,auVar50,auVar62);
            auVar50 = vpcmpgtd_avx(auVar66,auVar61);
            auVar62 = vpshufd_avx(auVar50,0xaa);
            auVar50 = vblendvps_avx(auVar66,auVar61,auVar62);
            auVar61 = vblendvps_avx(auVar61,auVar66,auVar62);
            auVar62 = vpcmpgtd_avx(auVar61,auVar51);
            auVar66 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar61,auVar51,auVar66);
            auVar51 = vblendvps_avx(auVar51,auVar61,auVar66);
            auVar61 = vpcmpgtd_avx(auVar50,auVar60);
            auVar66 = vpshufd_avx(auVar61,0xaa);
            auVar61 = vblendvps_avx(auVar50,auVar60,auVar66);
            auVar50 = vblendvps_avx(auVar60,auVar50,auVar66);
            auVar60 = vpcmpgtd_avx(auVar62,auVar50);
            auVar66 = vpshufd_avx(auVar60,0xaa);
            auVar60 = vblendvps_avx(auVar62,auVar50,auVar66);
            auVar50 = vblendvps_avx(auVar50,auVar62,auVar66);
            *pauVar42 = auVar51;
            pauVar42[1] = auVar50;
            pauVar42[2] = auVar60;
            auVar88 = ZEXT1664(local_14b0);
            uVar44 = auVar61._0_8_;
            pauVar42 = pauVar42 + 3;
          }
        }
      }
    }
    local_1540 = (ulong)((uint)uVar44 & 0xf) - 8;
    uVar44 = uVar44 & 0xfffffffffffffff0;
    for (lVar39 = 0; lVar39 != local_1540; lVar39 = lVar39 + 1) {
      lVar34 = lVar39 * 0xe0;
      lVar1 = uVar44 + 0xd0 + lVar34;
      local_13a0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1398 = *(undefined8 *)(lVar1 + 0x18);
      lVar1 = uVar44 + 0xc0 + lVar34;
      local_fc0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
      uStack_fb0 = local_fc0;
      uStack_fa8 = uStack_fb8;
      uStack_1390 = local_13a0;
      uStack_1388 = uStack_1398;
      auVar70._16_16_ = *(undefined1 (*) [16])(uVar44 + 0x60 + lVar34);
      auVar70._0_16_ = *(undefined1 (*) [16])(uVar44 + lVar34);
      auVar53._16_16_ = *(undefined1 (*) [16])(uVar44 + 0x70 + lVar34);
      auVar53._0_16_ = *(undefined1 (*) [16])(uVar44 + 0x10 + lVar34);
      auVar64._16_16_ = *(undefined1 (*) [16])(uVar44 + 0x80 + lVar34);
      auVar64._0_16_ = *(undefined1 (*) [16])(uVar44 + 0x20 + lVar34);
      auVar51 = *(undefined1 (*) [16])(uVar44 + 0x30 + lVar34);
      auVar87._16_16_ = auVar51;
      auVar87._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar44 + 0x40 + lVar34);
      auVar73._16_16_ = auVar51;
      auVar73._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar44 + 0x50 + lVar34);
      auVar79._16_16_ = auVar51;
      auVar79._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar44 + 0x90 + lVar34);
      auVar89._16_16_ = auVar51;
      auVar89._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar44 + 0xa0 + lVar34);
      auVar126._16_16_ = auVar51;
      auVar126._0_16_ = auVar51;
      auVar51 = *(undefined1 (*) [16])(uVar44 + 0xb0 + lVar34);
      auVar46._16_16_ = auVar51;
      auVar46._0_16_ = auVar51;
      uVar109 = *(undefined4 *)(ray + k * 4);
      auVar110._4_4_ = uVar109;
      auVar110._0_4_ = uVar109;
      auVar110._8_4_ = uVar109;
      auVar110._12_4_ = uVar109;
      auVar110._16_4_ = uVar109;
      auVar110._20_4_ = uVar109;
      auVar110._24_4_ = uVar109;
      auVar110._28_4_ = uVar109;
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar116._4_4_ = uVar109;
      auVar116._0_4_ = uVar109;
      auVar116._8_4_ = uVar109;
      auVar116._12_4_ = uVar109;
      auVar116._16_4_ = uVar109;
      auVar116._20_4_ = uVar109;
      auVar116._24_4_ = uVar109;
      auVar116._28_4_ = uVar109;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar121._4_4_ = uVar3;
      auVar121._0_4_ = uVar3;
      auVar121._8_4_ = uVar3;
      auVar121._12_4_ = uVar3;
      auVar121._16_4_ = uVar3;
      auVar121._20_4_ = uVar3;
      auVar121._24_4_ = uVar3;
      auVar121._28_4_ = uVar3;
      local_1500 = vsubps_avx(auVar70,auVar110);
      auVar53 = vsubps_avx(auVar53,auVar116);
      auVar52 = vsubps_avx(auVar64,auVar121);
      auVar69 = vsubps_avx(auVar87,auVar110);
      auVar58 = vsubps_avx(auVar73,auVar116);
      auVar12 = vsubps_avx(auVar79,auVar121);
      auVar64 = vsubps_avx(auVar89,auVar110);
      auVar70 = vsubps_avx(auVar126,auVar116);
      auVar13 = vsubps_avx(auVar46,auVar121);
      auVar46 = vsubps_avx(auVar64,local_1500);
      local_1000 = vsubps_avx(auVar70,auVar53);
      local_fe0 = vsubps_avx(auVar13,auVar52);
      auVar47._0_4_ = local_1500._0_4_ + auVar64._0_4_;
      auVar47._4_4_ = local_1500._4_4_ + auVar64._4_4_;
      auVar47._8_4_ = local_1500._8_4_ + auVar64._8_4_;
      auVar47._12_4_ = local_1500._12_4_ + auVar64._12_4_;
      auVar47._16_4_ = local_1500._16_4_ + auVar64._16_4_;
      auVar47._20_4_ = local_1500._20_4_ + auVar64._20_4_;
      auVar47._24_4_ = local_1500._24_4_ + auVar64._24_4_;
      auVar47._28_4_ = local_1500._28_4_ + auVar64._28_4_;
      auVar90._0_4_ = auVar70._0_4_ + auVar53._0_4_;
      auVar90._4_4_ = auVar70._4_4_ + auVar53._4_4_;
      auVar90._8_4_ = auVar70._8_4_ + auVar53._8_4_;
      auVar90._12_4_ = auVar70._12_4_ + auVar53._12_4_;
      auVar90._16_4_ = auVar70._16_4_ + auVar53._16_4_;
      auVar90._20_4_ = auVar70._20_4_ + auVar53._20_4_;
      auVar90._24_4_ = auVar70._24_4_ + auVar53._24_4_;
      auVar90._28_4_ = auVar70._28_4_ + auVar53._28_4_;
      fVar115 = auVar52._0_4_;
      auVar74._0_4_ = auVar13._0_4_ + fVar115;
      fVar120 = auVar52._4_4_;
      auVar74._4_4_ = auVar13._4_4_ + fVar120;
      fVar125 = auVar52._8_4_;
      auVar74._8_4_ = auVar13._8_4_ + fVar125;
      fVar105 = auVar52._12_4_;
      auVar74._12_4_ = auVar13._12_4_ + fVar105;
      fVar108 = auVar52._16_4_;
      auVar74._16_4_ = auVar13._16_4_ + fVar108;
      fVar113 = auVar52._20_4_;
      auVar74._20_4_ = auVar13._20_4_ + fVar113;
      fVar107 = auVar52._24_4_;
      auVar74._24_4_ = auVar13._24_4_ + fVar107;
      fVar99 = auVar13._28_4_;
      auVar74._28_4_ = fVar99 + auVar52._28_4_;
      auVar14._4_4_ = local_fe0._4_4_ * auVar90._4_4_;
      auVar14._0_4_ = local_fe0._0_4_ * auVar90._0_4_;
      auVar14._8_4_ = local_fe0._8_4_ * auVar90._8_4_;
      auVar14._12_4_ = local_fe0._12_4_ * auVar90._12_4_;
      auVar14._16_4_ = local_fe0._16_4_ * auVar90._16_4_;
      auVar14._20_4_ = local_fe0._20_4_ * auVar90._20_4_;
      auVar14._24_4_ = local_fe0._24_4_ * auVar90._24_4_;
      auVar14._28_4_ = uVar109;
      auVar50 = vfmsub231ps_fma(auVar14,local_1000,auVar74);
      auVar15._4_4_ = auVar46._4_4_ * auVar74._4_4_;
      auVar15._0_4_ = auVar46._0_4_ * auVar74._0_4_;
      auVar15._8_4_ = auVar46._8_4_ * auVar74._8_4_;
      auVar15._12_4_ = auVar46._12_4_ * auVar74._12_4_;
      auVar15._16_4_ = auVar46._16_4_ * auVar74._16_4_;
      auVar15._20_4_ = auVar46._20_4_ * auVar74._20_4_;
      auVar15._24_4_ = auVar46._24_4_ * auVar74._24_4_;
      auVar15._28_4_ = auVar74._28_4_;
      auVar51 = vfmsub231ps_fma(auVar15,local_fe0,auVar47);
      auVar16._4_4_ = local_1000._4_4_ * auVar47._4_4_;
      auVar16._0_4_ = local_1000._0_4_ * auVar47._0_4_;
      auVar16._8_4_ = local_1000._8_4_ * auVar47._8_4_;
      auVar16._12_4_ = local_1000._12_4_ * auVar47._12_4_;
      auVar16._16_4_ = local_1000._16_4_ * auVar47._16_4_;
      auVar16._20_4_ = local_1000._20_4_ * auVar47._20_4_;
      auVar16._24_4_ = local_1000._24_4_ * auVar47._24_4_;
      auVar16._28_4_ = auVar47._28_4_;
      auVar60 = vfmsub231ps_fma(auVar16,auVar46,auVar90);
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar111._4_4_ = uVar109;
      auVar111._0_4_ = uVar109;
      auVar111._8_4_ = uVar109;
      auVar111._12_4_ = uVar109;
      auVar111._16_4_ = uVar109;
      auVar111._20_4_ = uVar109;
      auVar111._24_4_ = uVar109;
      auVar111._28_4_ = uVar109;
      local_1040 = *(float *)(ray + k * 4 + 0x60);
      auVar17._4_4_ = local_1040 * auVar60._4_4_;
      auVar17._0_4_ = local_1040 * auVar60._0_4_;
      auVar17._8_4_ = local_1040 * auVar60._8_4_;
      auVar17._12_4_ = local_1040 * auVar60._12_4_;
      auVar17._16_4_ = local_1040 * 0.0;
      auVar17._20_4_ = local_1040 * 0.0;
      auVar17._24_4_ = local_1040 * 0.0;
      auVar17._28_4_ = fVar99;
      auVar51 = vfmadd231ps_fma(auVar17,auVar111,ZEXT1632(auVar51));
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_1020._4_4_ = uVar109;
      local_1020._0_4_ = uVar109;
      local_1020._8_4_ = uVar109;
      local_1020._12_4_ = uVar109;
      local_1020._16_4_ = uVar109;
      local_1020._20_4_ = uVar109;
      local_1020._24_4_ = uVar109;
      local_1020._28_4_ = uVar109;
      local_12e0 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1020,ZEXT1632(auVar50));
      local_1060 = vsubps_avx(auVar53,auVar58);
      local_1080 = vsubps_avx(auVar52,auVar12);
      auVar54._0_4_ = auVar58._0_4_ + auVar53._0_4_;
      auVar54._4_4_ = auVar58._4_4_ + auVar53._4_4_;
      auVar54._8_4_ = auVar58._8_4_ + auVar53._8_4_;
      auVar54._12_4_ = auVar58._12_4_ + auVar53._12_4_;
      auVar54._16_4_ = auVar58._16_4_ + auVar53._16_4_;
      auVar54._20_4_ = auVar58._20_4_ + auVar53._20_4_;
      auVar54._24_4_ = auVar58._24_4_ + auVar53._24_4_;
      auVar54._28_4_ = auVar58._28_4_ + auVar53._28_4_;
      auVar75._0_4_ = fVar115 + auVar12._0_4_;
      auVar75._4_4_ = fVar120 + auVar12._4_4_;
      auVar75._8_4_ = fVar125 + auVar12._8_4_;
      auVar75._12_4_ = fVar105 + auVar12._12_4_;
      auVar75._16_4_ = fVar108 + auVar12._16_4_;
      auVar75._20_4_ = fVar113 + auVar12._20_4_;
      auVar75._24_4_ = fVar107 + auVar12._24_4_;
      fVar94 = auVar12._28_4_;
      auVar75._28_4_ = auVar52._28_4_ + fVar94;
      fVar81 = local_1080._0_4_;
      fVar84 = local_1080._4_4_;
      auVar18._4_4_ = auVar54._4_4_ * fVar84;
      auVar18._0_4_ = auVar54._0_4_ * fVar81;
      fVar114 = local_1080._8_4_;
      auVar18._8_4_ = auVar54._8_4_ * fVar114;
      fVar119 = local_1080._12_4_;
      auVar18._12_4_ = auVar54._12_4_ * fVar119;
      fVar124 = local_1080._16_4_;
      auVar18._16_4_ = auVar54._16_4_ * fVar124;
      fVar129 = local_1080._20_4_;
      auVar18._20_4_ = auVar54._20_4_ * fVar129;
      fVar9 = local_1080._24_4_;
      auVar18._24_4_ = auVar54._24_4_ * fVar9;
      auVar18._28_4_ = auVar90._28_4_;
      auVar50 = vfmsub231ps_fma(auVar18,local_1060,auVar75);
      local_10a0 = vsubps_avx(local_1500,auVar69);
      fVar82 = local_10a0._0_4_;
      fVar85 = local_10a0._4_4_;
      auVar19._4_4_ = auVar75._4_4_ * fVar85;
      auVar19._0_4_ = auVar75._0_4_ * fVar82;
      fVar117 = local_10a0._8_4_;
      auVar19._8_4_ = auVar75._8_4_ * fVar117;
      fVar122 = local_10a0._12_4_;
      auVar19._12_4_ = auVar75._12_4_ * fVar122;
      fVar127 = local_10a0._16_4_;
      auVar19._16_4_ = auVar75._16_4_ * fVar127;
      fVar7 = local_10a0._20_4_;
      auVar19._20_4_ = auVar75._20_4_ * fVar7;
      fVar10 = local_10a0._24_4_;
      auVar19._24_4_ = auVar75._24_4_ * fVar10;
      auVar19._28_4_ = auVar75._28_4_;
      auVar95._0_4_ = local_1500._0_4_ + auVar69._0_4_;
      auVar95._4_4_ = local_1500._4_4_ + auVar69._4_4_;
      auVar95._8_4_ = local_1500._8_4_ + auVar69._8_4_;
      auVar95._12_4_ = local_1500._12_4_ + auVar69._12_4_;
      auVar95._16_4_ = local_1500._16_4_ + auVar69._16_4_;
      auVar95._20_4_ = local_1500._20_4_ + auVar69._20_4_;
      auVar95._24_4_ = local_1500._24_4_ + auVar69._24_4_;
      auVar95._28_4_ = local_1500._28_4_ + auVar69._28_4_;
      auVar51 = vfmsub231ps_fma(auVar19,local_1080,auVar95);
      fVar83 = local_1060._0_4_;
      fVar86 = local_1060._4_4_;
      auVar20._4_4_ = auVar95._4_4_ * fVar86;
      auVar20._0_4_ = auVar95._0_4_ * fVar83;
      fVar118 = local_1060._8_4_;
      auVar20._8_4_ = auVar95._8_4_ * fVar118;
      fVar123 = local_1060._12_4_;
      auVar20._12_4_ = auVar95._12_4_ * fVar123;
      fVar128 = local_1060._16_4_;
      auVar20._16_4_ = auVar95._16_4_ * fVar128;
      fVar8 = local_1060._20_4_;
      auVar20._20_4_ = auVar95._20_4_ * fVar8;
      fVar11 = local_1060._24_4_;
      auVar20._24_4_ = auVar95._24_4_ * fVar11;
      auVar20._28_4_ = auVar95._28_4_;
      auVar60 = vfmsub231ps_fma(auVar20,local_10a0,auVar54);
      auVar96._0_4_ = auVar60._0_4_ * local_1040;
      auVar96._4_4_ = auVar60._4_4_ * local_1040;
      auVar96._8_4_ = auVar60._8_4_ * local_1040;
      auVar96._12_4_ = auVar60._12_4_ * local_1040;
      auVar96._16_4_ = local_1040 * 0.0;
      auVar96._20_4_ = local_1040 * 0.0;
      auVar96._24_4_ = local_1040 * 0.0;
      auVar96._28_4_ = 0;
      auVar51 = vfmadd231ps_fma(auVar96,auVar111,ZEXT1632(auVar51));
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1020,ZEXT1632(auVar50));
      auVar14 = vsubps_avx(auVar69,auVar64);
      auVar71._0_4_ = auVar69._0_4_ + auVar64._0_4_;
      auVar71._4_4_ = auVar69._4_4_ + auVar64._4_4_;
      auVar71._8_4_ = auVar69._8_4_ + auVar64._8_4_;
      auVar71._12_4_ = auVar69._12_4_ + auVar64._12_4_;
      auVar71._16_4_ = auVar69._16_4_ + auVar64._16_4_;
      auVar71._20_4_ = auVar69._20_4_ + auVar64._20_4_;
      auVar71._24_4_ = auVar69._24_4_ + auVar64._24_4_;
      auVar71._28_4_ = auVar69._28_4_ + auVar64._28_4_;
      auVar64 = vsubps_avx(auVar58,auVar70);
      auVar80._0_4_ = auVar58._0_4_ + auVar70._0_4_;
      auVar80._4_4_ = auVar58._4_4_ + auVar70._4_4_;
      auVar80._8_4_ = auVar58._8_4_ + auVar70._8_4_;
      auVar80._12_4_ = auVar58._12_4_ + auVar70._12_4_;
      auVar80._16_4_ = auVar58._16_4_ + auVar70._16_4_;
      auVar80._20_4_ = auVar58._20_4_ + auVar70._20_4_;
      auVar80._24_4_ = auVar58._24_4_ + auVar70._24_4_;
      auVar80._28_4_ = auVar58._28_4_ + auVar70._28_4_;
      auVar70 = vsubps_avx(auVar12,auVar13);
      auVar55._0_4_ = auVar12._0_4_ + auVar13._0_4_;
      auVar55._4_4_ = auVar12._4_4_ + auVar13._4_4_;
      auVar55._8_4_ = auVar12._8_4_ + auVar13._8_4_;
      auVar55._12_4_ = auVar12._12_4_ + auVar13._12_4_;
      auVar55._16_4_ = auVar12._16_4_ + auVar13._16_4_;
      auVar55._20_4_ = auVar12._20_4_ + auVar13._20_4_;
      auVar55._24_4_ = auVar12._24_4_ + auVar13._24_4_;
      auVar55._28_4_ = fVar94 + fVar99;
      auVar58._4_4_ = auVar70._4_4_ * auVar80._4_4_;
      auVar58._0_4_ = auVar70._0_4_ * auVar80._0_4_;
      auVar58._8_4_ = auVar70._8_4_ * auVar80._8_4_;
      auVar58._12_4_ = auVar70._12_4_ * auVar80._12_4_;
      auVar58._16_4_ = auVar70._16_4_ * auVar80._16_4_;
      auVar58._20_4_ = auVar70._20_4_ * auVar80._20_4_;
      auVar58._24_4_ = auVar70._24_4_ * auVar80._24_4_;
      auVar58._28_4_ = fVar94;
      auVar60 = vfmsub231ps_fma(auVar58,auVar64,auVar55);
      auVar12._4_4_ = auVar55._4_4_ * auVar14._4_4_;
      auVar12._0_4_ = auVar55._0_4_ * auVar14._0_4_;
      auVar12._8_4_ = auVar55._8_4_ * auVar14._8_4_;
      auVar12._12_4_ = auVar55._12_4_ * auVar14._12_4_;
      auVar12._16_4_ = auVar55._16_4_ * auVar14._16_4_;
      auVar12._20_4_ = auVar55._20_4_ * auVar14._20_4_;
      auVar12._24_4_ = auVar55._24_4_ * auVar14._24_4_;
      auVar12._28_4_ = auVar55._28_4_;
      auVar50 = vfmsub231ps_fma(auVar12,auVar70,auVar71);
      auVar13._4_4_ = auVar64._4_4_ * auVar71._4_4_;
      auVar13._0_4_ = auVar64._0_4_ * auVar71._0_4_;
      auVar13._8_4_ = auVar64._8_4_ * auVar71._8_4_;
      auVar13._12_4_ = auVar64._12_4_ * auVar71._12_4_;
      auVar13._16_4_ = auVar64._16_4_ * auVar71._16_4_;
      auVar13._20_4_ = auVar64._20_4_ * auVar71._20_4_;
      auVar13._24_4_ = auVar64._24_4_ * auVar71._24_4_;
      auVar13._28_4_ = auVar71._28_4_;
      auVar61 = vfmsub231ps_fma(auVar13,auVar14,auVar80);
      fStack_103c = local_1040;
      fStack_1038 = local_1040;
      fStack_1034 = local_1040;
      fStack_1030 = local_1040;
      fStack_102c = local_1040;
      fStack_1028 = local_1040;
      fStack_1024 = local_1040;
      auVar72._0_4_ = local_1040 * auVar61._0_4_;
      auVar72._4_4_ = local_1040 * auVar61._4_4_;
      auVar72._8_4_ = local_1040 * auVar61._8_4_;
      auVar72._12_4_ = local_1040 * auVar61._12_4_;
      auVar72._16_4_ = local_1040 * 0.0;
      auVar72._20_4_ = local_1040 * 0.0;
      auVar72._24_4_ = local_1040 * 0.0;
      auVar72._28_4_ = 0;
      auVar50 = vfmadd231ps_fma(auVar72,auVar111,ZEXT1632(auVar50));
      auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),local_1020,ZEXT1632(auVar60));
      local_12c0 = ZEXT1632(auVar51);
      local_12a0 = ZEXT1632(CONCAT412(auVar50._12_4_ + auVar51._12_4_ + local_12e0._12_4_,
                                      CONCAT48(auVar50._8_4_ + auVar51._8_4_ + local_12e0._8_4_,
                                               CONCAT44(auVar50._4_4_ +
                                                        auVar51._4_4_ + local_12e0._4_4_,
                                                        auVar50._0_4_ +
                                                        auVar51._0_4_ + local_12e0._0_4_))));
      auVar56._8_4_ = 0x7fffffff;
      auVar56._0_8_ = 0x7fffffff7fffffff;
      auVar56._12_4_ = 0x7fffffff;
      auVar56._16_4_ = 0x7fffffff;
      auVar56._20_4_ = 0x7fffffff;
      auVar56._24_4_ = 0x7fffffff;
      auVar56._28_4_ = 0x7fffffff;
      auVar52 = vminps_avx(ZEXT1632(local_12e0),local_12c0);
      auVar52 = vminps_avx(auVar52,ZEXT1632(auVar50));
      local_10e0 = vandps_avx(local_12a0,auVar56);
      fVar94 = local_10e0._0_4_ * 1.1920929e-07;
      fVar99 = local_10e0._4_4_ * 1.1920929e-07;
      auVar21._4_4_ = fVar99;
      auVar21._0_4_ = fVar94;
      fVar100 = local_10e0._8_4_ * 1.1920929e-07;
      auVar21._8_4_ = fVar100;
      fVar101 = local_10e0._12_4_ * 1.1920929e-07;
      auVar21._12_4_ = fVar101;
      fVar102 = local_10e0._16_4_ * 1.1920929e-07;
      auVar21._16_4_ = fVar102;
      fVar103 = local_10e0._20_4_ * 1.1920929e-07;
      auVar21._20_4_ = fVar103;
      fVar104 = local_10e0._24_4_ * 1.1920929e-07;
      auVar21._24_4_ = fVar104;
      auVar21._28_4_ = 0x34000000;
      auVar91._0_8_ = CONCAT44(fVar99,fVar94) ^ 0x8000000080000000;
      auVar91._8_4_ = -fVar100;
      auVar91._12_4_ = -fVar101;
      auVar91._16_4_ = -fVar102;
      auVar91._20_4_ = -fVar103;
      auVar91._24_4_ = -fVar104;
      auVar91._28_4_ = 0xb4000000;
      auVar52 = vcmpps_avx(auVar52,auVar91,5);
      local_10c0 = ZEXT1632(local_12e0);
      auVar58 = vmaxps_avx(ZEXT1632(local_12e0),local_12c0);
      auVar69 = vmaxps_avx(auVar58,ZEXT1632(auVar50));
      auVar69 = vcmpps_avx(auVar69,auVar21,2);
      auVar69 = vorps_avx(auVar52,auVar69);
      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar69 >> 0x7f,0) != '\0') ||
            (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar69 >> 0xbf,0) != '\0') ||
          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar69[0x1f] < '\0') {
        auVar22._4_4_ = fVar86 * local_fe0._4_4_;
        auVar22._0_4_ = fVar83 * local_fe0._0_4_;
        auVar22._8_4_ = fVar118 * local_fe0._8_4_;
        auVar22._12_4_ = fVar123 * local_fe0._12_4_;
        auVar22._16_4_ = fVar128 * local_fe0._16_4_;
        auVar22._20_4_ = fVar8 * local_fe0._20_4_;
        auVar22._24_4_ = fVar11 * local_fe0._24_4_;
        auVar22._28_4_ = auVar52._28_4_;
        auVar23._4_4_ = fVar85 * local_1000._4_4_;
        auVar23._0_4_ = fVar82 * local_1000._0_4_;
        auVar23._8_4_ = fVar117 * local_1000._8_4_;
        auVar23._12_4_ = fVar122 * local_1000._12_4_;
        auVar23._16_4_ = fVar127 * local_1000._16_4_;
        auVar23._20_4_ = fVar7 * local_1000._20_4_;
        auVar23._24_4_ = fVar10 * local_1000._24_4_;
        auVar23._28_4_ = 0x34000000;
        auVar50 = vfmsub213ps_fma(local_1000,local_1080,auVar22);
        auVar24._4_4_ = auVar64._4_4_ * fVar84;
        auVar24._0_4_ = auVar64._0_4_ * fVar81;
        auVar24._8_4_ = auVar64._8_4_ * fVar114;
        auVar24._12_4_ = auVar64._12_4_ * fVar119;
        auVar24._16_4_ = auVar64._16_4_ * fVar124;
        auVar24._20_4_ = auVar64._20_4_ * fVar129;
        auVar24._24_4_ = auVar64._24_4_ * fVar9;
        auVar24._28_4_ = auVar58._28_4_;
        auVar25._4_4_ = fVar85 * auVar70._4_4_;
        auVar25._0_4_ = fVar82 * auVar70._0_4_;
        auVar25._8_4_ = fVar117 * auVar70._8_4_;
        auVar25._12_4_ = fVar122 * auVar70._12_4_;
        auVar25._16_4_ = fVar127 * auVar70._16_4_;
        auVar25._20_4_ = fVar7 * auVar70._20_4_;
        auVar25._24_4_ = fVar10 * auVar70._24_4_;
        auVar25._28_4_ = local_10e0._28_4_;
        auVar60 = vfmsub213ps_fma(auVar70,local_1060,auVar24);
        auVar52 = vandps_avx(auVar22,auVar56);
        auVar58 = vandps_avx(auVar24,auVar56);
        auVar52 = vcmpps_avx(auVar52,auVar58,1);
        local_1280 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar50),auVar52);
        auVar26._4_4_ = fVar86 * auVar14._4_4_;
        auVar26._0_4_ = fVar83 * auVar14._0_4_;
        auVar26._8_4_ = fVar118 * auVar14._8_4_;
        auVar26._12_4_ = fVar123 * auVar14._12_4_;
        auVar26._16_4_ = fVar128 * auVar14._16_4_;
        auVar26._20_4_ = fVar8 * auVar14._20_4_;
        auVar26._24_4_ = fVar11 * auVar14._24_4_;
        auVar26._28_4_ = auVar52._28_4_;
        auVar50 = vfmsub213ps_fma(auVar14,local_1080,auVar25);
        auVar27._4_4_ = auVar46._4_4_ * fVar84;
        auVar27._0_4_ = auVar46._0_4_ * fVar81;
        auVar27._8_4_ = auVar46._8_4_ * fVar114;
        auVar27._12_4_ = auVar46._12_4_ * fVar119;
        auVar27._16_4_ = auVar46._16_4_ * fVar124;
        auVar27._20_4_ = auVar46._20_4_ * fVar129;
        auVar27._24_4_ = auVar46._24_4_ * fVar9;
        auVar27._28_4_ = auVar58._28_4_;
        auVar60 = vfmsub213ps_fma(local_fe0,local_10a0,auVar27);
        auVar52 = vandps_avx(auVar27,auVar56);
        auVar58 = vandps_avx(auVar25,auVar56);
        auVar52 = vcmpps_avx(auVar52,auVar58,1);
        local_1260 = vblendvps_avx(ZEXT1632(auVar50),ZEXT1632(auVar60),auVar52);
        auVar50 = vfmsub213ps_fma(auVar46,local_1060,auVar23);
        auVar60 = vfmsub213ps_fma(auVar64,local_10a0,auVar26);
        auVar52 = vandps_avx(auVar23,auVar56);
        auVar58 = vandps_avx(auVar26,auVar56);
        auVar58 = vcmpps_avx(auVar52,auVar58,1);
        local_1240 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar50),auVar58);
        auVar50 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
        fVar94 = local_1240._0_4_;
        auVar57._0_4_ = fVar94 * local_1040;
        fVar81 = local_1240._4_4_;
        auVar57._4_4_ = fVar81 * local_1040;
        fVar82 = local_1240._8_4_;
        auVar57._8_4_ = fVar82 * local_1040;
        fVar83 = local_1240._12_4_;
        auVar57._12_4_ = fVar83 * local_1040;
        fVar84 = local_1240._16_4_;
        auVar57._16_4_ = fVar84 * local_1040;
        fVar85 = local_1240._20_4_;
        auVar57._20_4_ = fVar85 * local_1040;
        fVar86 = local_1240._24_4_;
        auVar57._24_4_ = fVar86 * local_1040;
        auVar57._28_4_ = 0;
        auVar60 = vfmadd213ps_fma(auVar111,local_1260,auVar57);
        auVar60 = vfmadd213ps_fma(local_1020,local_1280,ZEXT1632(auVar60));
        auVar58 = ZEXT1632(CONCAT412(auVar60._12_4_ + auVar60._12_4_,
                                     CONCAT48(auVar60._8_4_ + auVar60._8_4_,
                                              CONCAT44(auVar60._4_4_ + auVar60._4_4_,
                                                       auVar60._0_4_ + auVar60._0_4_))));
        auVar28._4_4_ = fVar81 * fVar120;
        auVar28._0_4_ = fVar94 * fVar115;
        auVar28._8_4_ = fVar82 * fVar125;
        auVar28._12_4_ = fVar83 * fVar105;
        auVar28._16_4_ = fVar84 * fVar108;
        auVar28._20_4_ = fVar85 * fVar113;
        auVar28._24_4_ = fVar86 * fVar107;
        auVar28._28_4_ = auVar52._28_4_;
        auVar60 = vfmadd213ps_fma(auVar53,local_1260,auVar28);
        auVar61 = vfmadd213ps_fma(local_1500,local_1280,ZEXT1632(auVar60));
        auVar52 = vrcpps_avx(auVar58);
        auVar106._8_4_ = 0x3f800000;
        auVar106._0_8_ = 0x3f8000003f800000;
        auVar106._12_4_ = 0x3f800000;
        auVar106._16_4_ = 0x3f800000;
        auVar106._20_4_ = 0x3f800000;
        auVar106._24_4_ = 0x3f800000;
        auVar106._28_4_ = 0x3f800000;
        auVar60 = vfnmadd213ps_fma(auVar52,auVar58,auVar106);
        auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar52,auVar52);
        local_11c0._28_4_ = 0x3f800000;
        local_11c0._0_28_ =
             ZEXT1628(CONCAT412(auVar60._12_4_ * (auVar61._12_4_ + auVar61._12_4_),
                                CONCAT48(auVar60._8_4_ * (auVar61._8_4_ + auVar61._8_4_),
                                         CONCAT44(auVar60._4_4_ * (auVar61._4_4_ + auVar61._4_4_),
                                                  auVar60._0_4_ * (auVar61._0_4_ + auVar61._0_4_))))
                     );
        auVar49 = ZEXT3264(local_11c0);
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar76._4_4_ = uVar109;
        auVar76._0_4_ = uVar109;
        auVar76._8_4_ = uVar109;
        auVar76._12_4_ = uVar109;
        auVar76._16_4_ = uVar109;
        auVar76._20_4_ = uVar109;
        auVar76._24_4_ = uVar109;
        auVar76._28_4_ = uVar109;
        uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar112._4_4_ = uVar109;
        auVar112._0_4_ = uVar109;
        auVar112._8_4_ = uVar109;
        auVar112._12_4_ = uVar109;
        auVar112._16_4_ = uVar109;
        auVar112._20_4_ = uVar109;
        auVar112._24_4_ = uVar109;
        auVar112._28_4_ = uVar109;
        auVar88 = ZEXT3264(auVar112);
        auVar52 = vcmpps_avx(auVar76,local_11c0,2);
        auVar69 = vcmpps_avx(local_11c0,auVar112,2);
        auVar52 = vandps_avx(auVar69,auVar52);
        auVar60 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
        auVar50 = vpand_avx(auVar60,auVar50);
        auVar52 = vpmovsxwd_avx2(auVar50);
        if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar52 >> 0x7f,0) != '\0') ||
              (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar52 >> 0xbf,0) != '\0') ||
            (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar52[0x1f] < '\0') {
          auVar52 = vcmpps_avx(auVar58,_DAT_01f7b000,4);
          auVar60 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
          auVar50 = vpand_avx(auVar50,auVar60);
          local_14e0 = vpmovsxwd_avx2(auVar50);
          if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_14e0 >> 0x7f,0) != '\0') ||
                (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_14e0 >> 0xbf,0) != '\0') ||
              (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_14e0[0x1f] < '\0') {
            uStack_12d0 = 0;
            uStack_12cc = 0;
            uStack_12c8 = 0;
            uStack_12c4 = 0;
            local_1220 = local_14e0;
            local_1140 = local_1100;
            pSVar37 = context->scene;
            auVar52 = vrcpps_avx(local_12a0);
            auVar97._8_4_ = 0x3f800000;
            auVar97._0_8_ = 0x3f8000003f800000;
            auVar97._12_4_ = 0x3f800000;
            auVar97._16_4_ = 0x3f800000;
            auVar97._20_4_ = 0x3f800000;
            auVar97._24_4_ = 0x3f800000;
            auVar97._28_4_ = 0x3f800000;
            auVar60 = vfnmadd213ps_fma(local_12a0,auVar52,auVar97);
            auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar52,auVar52);
            auVar77._8_4_ = 0x219392ef;
            auVar77._0_8_ = 0x219392ef219392ef;
            auVar77._12_4_ = 0x219392ef;
            auVar77._16_4_ = 0x219392ef;
            auVar77._20_4_ = 0x219392ef;
            auVar77._24_4_ = 0x219392ef;
            auVar77._28_4_ = 0x219392ef;
            auVar52 = vcmpps_avx(local_10e0,auVar77,5);
            auVar52 = vandps_avx(auVar52,ZEXT1632(auVar60));
            auVar29._4_4_ = local_12e0._4_4_ * auVar52._4_4_;
            auVar29._0_4_ = local_12e0._0_4_ * auVar52._0_4_;
            auVar29._8_4_ = local_12e0._8_4_ * auVar52._8_4_;
            auVar29._12_4_ = local_12e0._12_4_ * auVar52._12_4_;
            auVar29._16_4_ = auVar52._16_4_ * 0.0;
            auVar29._20_4_ = auVar52._20_4_ * 0.0;
            auVar29._24_4_ = auVar52._24_4_ * 0.0;
            auVar29._28_4_ = 0;
            auVar69 = vminps_avx(auVar29,auVar97);
            auVar30._4_4_ = auVar51._4_4_ * auVar52._4_4_;
            auVar30._0_4_ = auVar51._0_4_ * auVar52._0_4_;
            auVar30._8_4_ = auVar51._8_4_ * auVar52._8_4_;
            auVar30._12_4_ = auVar51._12_4_ * auVar52._12_4_;
            auVar30._16_4_ = auVar52._16_4_ * 0.0;
            auVar30._20_4_ = auVar52._20_4_ * 0.0;
            auVar30._24_4_ = auVar52._24_4_ * 0.0;
            auVar30._28_4_ = local_1080._28_4_;
            auVar52 = vminps_avx(auVar30,auVar97);
            auVar58 = vsubps_avx(auVar97,auVar69);
            auVar12 = vsubps_avx(auVar97,auVar52);
            local_11e0 = vblendvps_avx(auVar52,auVar58,local_1100);
            local_1200 = vblendvps_avx(auVar69,auVar12,local_1100);
            local_11a0[0] = local_1280._0_4_ * (float)local_1120._0_4_;
            local_11a0[1] = local_1280._4_4_ * (float)local_1120._4_4_;
            local_11a0[2] = local_1280._8_4_ * fStack_1118;
            local_11a0[3] = local_1280._12_4_ * fStack_1114;
            fStack_1190 = local_1280._16_4_ * fStack_1110;
            fStack_118c = local_1280._20_4_ * fStack_110c;
            fStack_1188 = local_1280._24_4_ * fStack_1108;
            uStack_1184 = local_1200._28_4_;
            local_1180[0] = (float)local_1120._0_4_ * local_1260._0_4_;
            local_1180[1] = (float)local_1120._4_4_ * local_1260._4_4_;
            local_1180[2] = fStack_1118 * local_1260._8_4_;
            local_1180[3] = fStack_1114 * local_1260._12_4_;
            fStack_1170 = fStack_1110 * local_1260._16_4_;
            fStack_116c = fStack_110c * local_1260._20_4_;
            fStack_1168 = fStack_1108 * local_1260._24_4_;
            uStack_1164 = local_11e0._28_4_;
            local_1160[0] = (float)local_1120._0_4_ * fVar94;
            local_1160[1] = (float)local_1120._4_4_ * fVar81;
            local_1160[2] = fStack_1118 * fVar82;
            local_1160[3] = fStack_1114 * fVar83;
            fStack_1150 = fStack_1110 * fVar84;
            fStack_114c = fStack_110c * fVar85;
            fStack_1148 = fStack_1108 * fVar86;
            uStack_1144 = uStack_1104;
            auVar52 = vpmovsxwd_avx2(auVar50);
            auVar65._8_4_ = 0x7f800000;
            auVar65._0_8_ = 0x7f8000007f800000;
            auVar65._12_4_ = 0x7f800000;
            auVar65._16_4_ = 0x7f800000;
            auVar65._20_4_ = 0x7f800000;
            auVar65._24_4_ = 0x7f800000;
            auVar65._28_4_ = 0x7f800000;
            auVar52 = vblendvps_avx(auVar65,local_11c0,auVar52);
            auVar69 = vshufps_avx(auVar52,auVar52,0xb1);
            auVar69 = vminps_avx(auVar52,auVar69);
            auVar58 = vshufpd_avx(auVar69,auVar69,5);
            auVar69 = vminps_avx(auVar69,auVar58);
            auVar58 = vpermpd_avx2(auVar69,0x4e);
            auVar69 = vminps_avx(auVar69,auVar58);
            auVar52 = vcmpps_avx(auVar52,auVar69,0);
            auVar51 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
            auVar51 = vpand_avx(auVar51,auVar50);
            auVar52 = vpmovsxwd_avx2(auVar51);
            if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar52 >> 0x7f,0) == '\0') &&
                  (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar52 >> 0xbf,0) == '\0') &&
                (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar52[0x1f]) {
              auVar52 = local_14e0;
            }
            uVar33 = vmovmskps_avx(auVar52);
            uVar32 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
              uVar32 = uVar32 + 1;
            }
            auVar51 = vpcmpeqd_avx(local_1260._0_16_,local_1260._0_16_);
            auVar92 = ZEXT1664(auVar51);
            auStack_1458 = auVar53._8_24_;
            local_1460 = pSVar37;
            do {
              uVar43 = CONCAT44(0,uVar32);
              uVar32 = *(uint *)((long)&local_fc0 + uVar43 * 4);
              pGVar5 = (pSVar37->geometries).items[uVar32].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_14e0 + uVar43 * 4) = 0;
                pSVar37 = local_1460;
              }
              else {
                local_1500._0_8_ = uVar43;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar109 = *(undefined4 *)(local_1200 + uVar43 * 4);
                  uVar3 = *(undefined4 *)(local_11e0 + uVar43 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar43 * 4);
                  *(float *)(ray + k * 4 + 0xc0) = local_11a0[uVar43];
                  *(float *)(ray + k * 4 + 0xd0) = local_1180[uVar43];
                  *(float *)(ray + k * 4 + 0xe0) = local_1160[uVar43];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar109;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_13a0 + uVar43 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar32;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar109 = *(undefined4 *)(local_1200 + uVar43 * 4);
                local_1340._4_4_ = uVar109;
                local_1340._0_4_ = uVar109;
                local_1340._8_4_ = uVar109;
                local_1340._12_4_ = uVar109;
                local_1330 = *(undefined4 *)(local_11e0 + uVar43 * 4);
                local_1310._4_4_ = uVar32;
                local_1310._0_4_ = uVar32;
                local_1310._8_4_ = uVar32;
                local_1310._12_4_ = uVar32;
                uVar109 = *(undefined4 *)((long)&local_13a0 + uVar43 * 4);
                local_1320._4_4_ = uVar109;
                local_1320._0_4_ = uVar109;
                local_1320._8_4_ = uVar109;
                local_1320._12_4_ = uVar109;
                fVar115 = local_11a0[uVar43];
                fVar120 = local_1180[uVar43];
                local_1360._4_4_ = fVar120;
                local_1360._0_4_ = fVar120;
                local_1360._8_4_ = fVar120;
                local_1360._12_4_ = fVar120;
                fVar120 = local_1160[uVar43];
                local_1350._4_4_ = fVar120;
                local_1350._0_4_ = fVar120;
                local_1350._8_4_ = fVar120;
                local_1350._12_4_ = fVar120;
                local_1370[0] = (RTCHitN)SUB41(fVar115,0);
                local_1370[1] = (RTCHitN)(char)((uint)fVar115 >> 8);
                local_1370[2] = (RTCHitN)(char)((uint)fVar115 >> 0x10);
                local_1370[3] = (RTCHitN)(char)((uint)fVar115 >> 0x18);
                local_1370[4] = (RTCHitN)SUB41(fVar115,0);
                local_1370[5] = (RTCHitN)(char)((uint)fVar115 >> 8);
                local_1370[6] = (RTCHitN)(char)((uint)fVar115 >> 0x10);
                local_1370[7] = (RTCHitN)(char)((uint)fVar115 >> 0x18);
                local_1370[8] = (RTCHitN)SUB41(fVar115,0);
                local_1370[9] = (RTCHitN)(char)((uint)fVar115 >> 8);
                local_1370[10] = (RTCHitN)(char)((uint)fVar115 >> 0x10);
                local_1370[0xb] = (RTCHitN)(char)((uint)fVar115 >> 0x18);
                local_1370[0xc] = (RTCHitN)SUB41(fVar115,0);
                local_1370[0xd] = (RTCHitN)(char)((uint)fVar115 >> 8);
                local_1370[0xe] = (RTCHitN)(char)((uint)fVar115 >> 0x10);
                local_1370[0xf] = (RTCHitN)(char)((uint)fVar115 >> 0x18);
                uStack_132c = local_1330;
                uStack_1328 = local_1330;
                uStack_1324 = local_1330;
                vpcmpeqd_avx2(ZEXT1632(local_1340),ZEXT1632(local_1340));
                uStack_12fc = context->user->instID[0];
                local_1300 = uStack_12fc;
                uStack_12f8 = uStack_12fc;
                uStack_12f4 = uStack_12fc;
                uStack_12f0 = context->user->instPrimID[0];
                uStack_12ec = uStack_12f0;
                uStack_12e8 = uStack_12f0;
                uStack_12e4 = uStack_12f0;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar43 * 4);
                local_1560 = *local_1548;
                local_1530.valid = (int *)local_1560;
                local_1530.geometryUserPtr = pGVar5->userPtr;
                local_1530.context = context->user;
                local_1530.hit = local_1370;
                local_1530.N = 4;
                local_1480 = auVar49._0_32_;
                local_14a0 = auVar88._0_32_;
                local_1530.ray = (RTCRayN *)ray;
                if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar51 = auVar92._0_16_;
                  (*pGVar5->intersectionFilterN)(&local_1530);
                  auVar88 = ZEXT3264(local_14a0);
                  auVar49 = ZEXT3264(local_1480);
                  auVar51 = vpcmpeqd_avx(auVar51,auVar51);
                  auVar92 = ZEXT1664(auVar51);
                }
                auVar51 = auVar92._0_16_;
                if (local_1560 == (undefined1  [16])0x0) {
                  auVar50 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar50 = auVar50 ^ auVar51;
                }
                else {
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)(&local_1530);
                    auVar88 = ZEXT3264(local_14a0);
                    auVar49 = ZEXT3264(local_1480);
                    auVar51 = vpcmpeqd_avx(auVar51,auVar51);
                    auVar92 = ZEXT1664(auVar51);
                  }
                  auVar51 = vpcmpeqd_avx(local_1560,_DAT_01f45a50);
                  auVar50 = auVar51 ^ auVar92._0_16_;
                  if (local_1560 != (undefined1  [16])0x0) {
                    auVar51 = auVar51 ^ auVar92._0_16_;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])local_1530.hit);
                    *(undefined1 (*) [16])(local_1530.ray + 0xc0) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x10));
                    *(undefined1 (*) [16])(local_1530.ray + 0xd0) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x20));
                    *(undefined1 (*) [16])(local_1530.ray + 0xe0) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x30));
                    *(undefined1 (*) [16])(local_1530.ray + 0xf0) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x40));
                    *(undefined1 (*) [16])(local_1530.ray + 0x100) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x50));
                    *(undefined1 (*) [16])(local_1530.ray + 0x110) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x60));
                    *(undefined1 (*) [16])(local_1530.ray + 0x120) = auVar60;
                    auVar60 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x70));
                    *(undefined1 (*) [16])(local_1530.ray + 0x130) = auVar60;
                    auVar51 = vmaskmovps_avx(auVar51,*(undefined1 (*) [16])(local_1530.hit + 0x80));
                    *(undefined1 (*) [16])(local_1530.ray + 0x140) = auVar51;
                  }
                }
                auVar45._8_8_ = 0x100000001;
                auVar45._0_8_ = 0x100000001;
                pSVar37 = local_1460;
                if ((auVar45 & auVar50) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar88._0_4_;
                }
                else {
                  auVar88 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_14e0 + local_1500._0_8_ * 4) = 0;
                uVar109 = auVar88._0_4_;
                auVar48._4_4_ = uVar109;
                auVar48._0_4_ = uVar109;
                auVar48._8_4_ = uVar109;
                auVar48._12_4_ = uVar109;
                auVar48._16_4_ = uVar109;
                auVar48._20_4_ = uVar109;
                auVar48._24_4_ = uVar109;
                auVar48._28_4_ = uVar109;
                auVar52 = vcmpps_avx(auVar49._0_32_,auVar48,2);
                local_14e0 = vandps_avx(auVar52,local_14e0);
              }
              if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_14e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_14e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_14e0 >> 0x7f,0) == '\0') &&
                    (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_14e0 >> 0xbf,0) == '\0') &&
                  (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_14e0[0x1f]) break;
              auVar59._8_4_ = 0x7f800000;
              auVar59._0_8_ = 0x7f8000007f800000;
              auVar59._12_4_ = 0x7f800000;
              auVar59._16_4_ = 0x7f800000;
              auVar59._20_4_ = 0x7f800000;
              auVar59._24_4_ = 0x7f800000;
              auVar59._28_4_ = 0x7f800000;
              auVar52 = vblendvps_avx(auVar59,auVar49._0_32_,local_14e0);
              auVar69 = vshufps_avx(auVar52,auVar52,0xb1);
              auVar69 = vminps_avx(auVar52,auVar69);
              auVar58 = vshufpd_avx(auVar69,auVar69,5);
              auVar69 = vminps_avx(auVar69,auVar58);
              auVar58 = vpermpd_avx2(auVar69,0x4e);
              auVar69 = vminps_avx(auVar69,auVar58);
              auVar69 = vcmpps_avx(auVar52,auVar69,0);
              auVar58 = local_14e0 & auVar69;
              auVar52 = local_14e0;
              if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar58 >> 0x7f,0) != '\0') ||
                    (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar58 >> 0xbf,0) != '\0') ||
                  (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar58[0x1f] < '\0') {
                auVar52 = vandps_avx(auVar69,local_14e0);
              }
              uVar33 = vmovmskps_avx(auVar52);
              uVar32 = 0;
              for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
                uVar32 = uVar32 + 1;
              }
            } while( true );
          }
        }
      }
      auVar92 = ZEXT1664(local_13b0);
      auVar93 = ZEXT1664(local_13c0);
      auVar98 = ZEXT1664(local_13d0);
      auVar88 = ZEXT1664(local_14b0);
      fVar105 = local_13e0;
      fVar107 = fStack_13dc;
      fVar94 = fStack_13d8;
      fVar81 = fStack_13d4;
      fVar108 = local_13f0;
      fVar82 = fStack_13ec;
      fVar83 = fStack_13e8;
      fVar84 = fStack_13e4;
      fVar113 = local_1400;
      fVar85 = fStack_13fc;
      fVar86 = fStack_13f8;
      fVar114 = fStack_13f4;
      fVar115 = local_1410;
      fVar117 = fStack_140c;
      fVar118 = fStack_1408;
      fVar119 = fStack_1404;
      fVar120 = local_1420;
      fVar122 = fStack_141c;
      fVar123 = fStack_1418;
      fVar124 = fStack_1414;
      fVar125 = local_1430;
      fVar127 = fStack_142c;
      fVar128 = fStack_1428;
      fVar129 = fStack_1424;
    }
    uVar109 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar49 = ZEXT1664(CONCAT412(uVar109,CONCAT48(uVar109,CONCAT44(uVar109,uVar109))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }